

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

void Gia_IsoReportTopmost(Gia_IsoMan_t *p)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  Gia_Man_t *pGVar4;
  word *pwVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  Vec_Int_t *pVVar12;
  int *piVar13;
  Gia_Obj_t *pGVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  
  Gia_ManIncrementTravId(p->pGia);
  pVVar12 = p->vClasses;
  iVar10 = pVVar12->nSize;
  if (1 < iVar10) {
    piVar3 = pVVar12->pArray;
    lVar8 = 0;
    do {
      lVar9 = (long)piVar3[lVar8 + 1];
      if (0 < lVar9) {
        iVar10 = piVar3[lVar8];
        pGVar4 = p->pGia;
        pwVar5 = p->pStoreW;
        lVar11 = 0;
        do {
          uVar6 = pwVar5[iVar10 + lVar11];
          if ((long)uVar6 < 0) goto LAB_0071e398;
          uVar17 = uVar6 >> 0x20;
          uVar1 = pGVar4->nObjs;
          if ((int)uVar1 <= (int)(uVar6 >> 0x20)) goto LAB_0071e398;
          pGVar7 = pGVar4->pObjs;
          uVar6 = *(ulong *)(pGVar7 + uVar17);
          if ((uVar6 & 0x1fffffff) == 0x1fffffff || (int)(uint)uVar6 < 0) {
            if ((~(uint)uVar6 & 0x9fffffff) == 0) {
              uVar15 = (uint)(uVar6 >> 0x20) & 0x1fffffff;
              iVar16 = pGVar4->vCis->nSize;
              if (iVar16 - pGVar4->nRegs <= (int)uVar15) {
                iVar2 = pGVar4->vCos->nSize;
                uVar15 = (iVar2 - iVar16) + uVar15;
                if (((int)uVar15 < 0) || (iVar2 <= (int)uVar15)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                uVar15 = pGVar4->vCos->pArray[uVar15];
                if ((-1 < (long)(int)uVar15) && (uVar15 < uVar1)) {
                  pGVar14 = pGVar7 + (int)uVar15 +
                            -(ulong)((uint)*(undefined8 *)(pGVar7 + (int)uVar15) & 0x1fffffff);
                  if ((pGVar7 <= pGVar14) && (pGVar14 < pGVar7 + uVar1)) {
                    iVar16 = (int)((long)pGVar14 - (long)pGVar7 >> 2) * -0x55555555;
                    if (pGVar4->nTravIdsAlloc <= iVar16) goto LAB_0071e3d6;
                    iVar2 = pGVar4->nTravIds;
                    piVar13 = pGVar4->pTravIds;
                    goto LAB_0071e229;
                  }
                  goto LAB_0071e3b7;
                }
                goto LAB_0071e398;
              }
            }
          }
          else {
            pGVar14 = pGVar7 + (uVar17 - (uVar6 & 0x1fffffff));
            if ((pGVar14 < pGVar7) || (pGVar7 + uVar1 <= pGVar14)) goto LAB_0071e3b7;
            iVar16 = (int)((long)pGVar14 - (long)pGVar7 >> 2) * -0x55555555;
            if (pGVar4->nTravIdsAlloc <= iVar16) {
LAB_0071e3d6:
              __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                            ,0x25c,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
            }
            iVar2 = pGVar4->nTravIds;
            piVar13 = pGVar4->pTravIds;
            piVar13[iVar16] = iVar2;
            pGVar14 = pGVar7 + (uVar17 - (*(uint *)&pGVar7[uVar17].field_0x4 & 0x1fffffff));
            if ((pGVar14 < pGVar7) || (pGVar7 + pGVar4->nObjs <= pGVar14)) goto LAB_0071e3b7;
            iVar16 = (int)((long)pGVar14 - (long)pGVar7 >> 2) * -0x55555555;
            if (pGVar4->nTravIdsAlloc <= iVar16) goto LAB_0071e3d6;
LAB_0071e229:
            piVar13[iVar16] = iVar2;
          }
          lVar11 = lVar11 + 1;
        } while (lVar9 != lVar11);
        iVar10 = pVVar12->nSize;
      }
      lVar8 = lVar8 + 2;
    } while ((int)((uint)lVar8 | 1) < iVar10);
    if (1 < iVar10) {
      lVar8 = 0;
      do {
        uVar1 = pVVar12->pArray[lVar8 + 1];
        if (0 < (long)(int)uVar1) {
          lVar11 = (long)pVVar12->pArray[lVar8];
          pGVar4 = p->pGia;
          lVar9 = 0;
          do {
            uVar6 = p->pStoreW[lVar11 + lVar9];
            if ((long)uVar6 < 0) {
LAB_0071e398:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                            ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            uVar15 = (uint)(uVar6 >> 0x20);
            if (pGVar4->nObjs <= (int)uVar15) goto LAB_0071e398;
            if ((uint)pGVar4->nObjs <= uVar15) goto LAB_0071e3b7;
            if (pGVar4->nTravIdsAlloc <= (int)uVar15) {
              __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                            ,0x25e,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
            }
            if (*(int *)((long)pGVar4->pTravIds + (uVar6 >> 0x1e & 0x1fffffffc)) != pGVar4->nTravIds
               ) {
              pGVar14 = pGVar4->pObjs + (uVar6 >> 0x20);
              printf("%5d : ");
              pGVar7 = p->pGia->pObjs;
              if ((pGVar14 < pGVar7) || (pGVar7 + p->pGia->nObjs <= pGVar14)) {
LAB_0071e3b7:
                __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                              ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
              }
              lVar9 = (long)((int)((long)pGVar14 - (long)pGVar7 >> 2) * -0x55555555);
              printf("Obj %6d : Level = %4d.  iBegin = %4d.  Size = %4d.\n",lVar9,
                     (ulong)(uint)p->pLevels[lVar9],lVar11,(ulong)uVar1);
              pVVar12 = p->vClasses;
              break;
            }
            lVar9 = lVar9 + 1;
          } while ((int)uVar1 != lVar9);
        }
        lVar8 = lVar8 + 2;
      } while ((int)((uint)lVar8 | 1) < pVVar12->nSize);
    }
  }
  return;
}

Assistant:

void Gia_IsoReportTopmost( Gia_IsoMan_t * p )
{
    Gia_Obj_t * pObj;
    int i, k, iBegin, nSize, Counter = 0;
    // go through equivalence classes
    Gia_ManIncrementTravId( p->pGia );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
//        printf( "%d(%d) ", nSize, p->pLevels[Gia_IsoGetItem(p, iBegin)] );
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p, iBegin+k) );
            if ( Gia_ObjIsAnd(pObj) )
            {
                Gia_ObjSetTravIdCurrent( p->pGia, Gia_ObjFanin0(pObj) );
                Gia_ObjSetTravIdCurrent( p->pGia, Gia_ObjFanin1(pObj) );
            }
            else if ( Gia_ObjIsRo(p->pGia, pObj) )
                Gia_ObjSetTravIdCurrent( p->pGia, Gia_ObjFanin0(Gia_ObjRoToRi(p->pGia, pObj)) );
        }
    }
//    printf( "\n" );

    // report non-labeled nodes
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p, iBegin+k) );
            if ( !Gia_ObjIsTravIdCurrent(p->pGia, pObj) )
            {
                printf( "%5d : ", ++Counter );
                printf( "Obj %6d : Level = %4d.  iBegin = %4d.  Size = %4d.\n", 
                    Gia_ObjId(p->pGia, pObj), p->pLevels[Gia_ObjId(p->pGia, pObj)], iBegin, nSize );
                break;
            }
        }
    }
}